

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.h
# Opt level: O3

Expression __thiscall dynet::RNNBuilder::add_input(RNNBuilder *this,Expression *x)

{
  uint uVar1;
  iterator __position;
  undefined8 extraout_RDX;
  ComputationGraph *pCVar2;
  Expression EVar3;
  
  RNNStateMachine::transition((RNNStateMachine *)(x + 1),add_input);
  __position._M_current = (RNNPointer *)x[2].pg;
  if (__position._M_current == *(RNNPointer **)&x[2].i) {
    std::vector<dynet::RNNPointer,std::allocator<dynet::RNNPointer>>::
    _M_realloc_insert<dynet::RNNPointer_const&>
              ((vector<dynet::RNNPointer,std::allocator<dynet::RNNPointer>> *)&x[1].i,__position,
               (RNNPointer *)&x->i);
    uVar1 = (x->i).t;
    pCVar2 = x[2].pg;
  }
  else {
    uVar1 = (x->i).t;
    (__position._M_current)->t = uVar1;
    pCVar2 = (ComputationGraph *)(__position._M_current + 1);
    x[2].pg = pCVar2;
  }
  (x->i).t = (int)((ulong)((long)pCVar2 - *(long *)&x[1].i) >> 2) - 1;
  (**(code **)(x->pg + 0x68))(this,x,uVar1);
  EVar3._8_8_ = extraout_RDX;
  EVar3.pg = (ComputationGraph *)this;
  return EVar3;
}

Assistant:

Expression add_input(const Expression& x) {
    sm.transition(RNNOp::add_input);
    head.push_back(cur);
    int rcp = cur;
    cur = head.size() - 1;
    return add_input_impl(rcp, x);
  }